

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-lex.c
# Opt level: O3

int ztlex_fgetc(ztlex_t *lex)

{
  char *pcVar1;
  int iVar2;
  
  pcVar1 = lex->ungottenptr;
  if (lex->ungotten < pcVar1) {
    lex->ungottenptr = pcVar1 + -1;
    iVar2 = (int)pcVar1[-1];
  }
  else {
    iVar2 = fgetc((FILE *)lex->file);
  }
  if (iVar2 == 10) {
    lex->line = lex->line + 1;
    lex->prevcolumn = lex->column;
    lex->column = 1;
  }
  else {
    lex->column = lex->column + 1;
  }
  return iVar2;
}

Assistant:

static int ztlex_fgetc(ztlex_t *lex)
{
  int c;

  if (lex->ungottenptr > lex->ungotten)
    c = *--lex->ungottenptr;
  else
    c = fgetc(lex->file);

  if (c == '\n')
  {
    lex->line++;
    lex->prevcolumn = lex->column;
    lex->column     = 1;
  }
  else
  {
    lex->column++;
  }

  return c;
}